

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O2

void __thiscall Dumper::dumpNodeEdges(Dumper *this,RWNode *node)

{
  undefined8 *puVar1;
  RWNode *pRVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  RWCalledValue *cv;
  long *plVar8;
  undefined8 *puVar9;
  pair<std::_Rb_tree_iterator<dg::dda::RWNode_*>,_bool> pVar10;
  RWNode *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  local_48 = node;
  if ((dumpNodeEdges(dg::dda::RWNode*)::dumped == '\0') &&
     (iVar5 = __cxa_guard_acquire(&dumpNodeEdges(dg::dda::RWNode*)::dumped), iVar5 != 0)) {
    dumpNodeEdges::dumped._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    dumpNodeEdges::dumped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    dumpNodeEdges::dumped._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &dumpNodeEdges::dumped._M_t._M_impl.super__Rb_tree_header._M_header;
    dumpNodeEdges::dumped._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &dumpNodeEdges::dumped._M_t._M_impl.super__Rb_tree_header._M_header;
    dumpNodeEdges::dumped._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::
                 set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                 ::~set,&dumpNodeEdges::dumped,&__dso_handle);
    __cxa_guard_release(&dumpNodeEdges(dg::dda::RWNode*)::dumped);
  }
  pVar10 = std::
           _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
           ::_M_insert_unique<dg::dda::RWNode*const&>
                     ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                       *)&dumpNodeEdges::dumped,&local_48);
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if ((verbose[0x80] != '\0') || (*(int *)(local_48 + 0x90) - 6U < 5)) {
      puVar1 = *(undefined8 **)(local_48 + 0x138);
      for (puVar9 = *(undefined8 **)(local_48 + 0x130); puVar9 != puVar1; puVar9 = puVar9 + 1) {
        printf("\tNODE%p->NODE%p [style=dotted constraint=false]\n",*puVar9,local_48);
      }
    }
    if ((graph_only[0x80] == '\0') &&
       (lVar6 = (**(code **)(*(long *)local_48 + 0x18))(local_48), *(long *)(lVar6 + 0x88) != 0)) {
      plVar8 = *(long **)(this->DDA->DDA)._M_t.
                         super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
                         .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>.
                         _M_head_impl;
      (**(code **)(*plVar8 + 0x20))(&local_40,plVar8,local_48);
      for (; local_40 != local_38; local_40 = local_40 + 1) {
        pRVar2 = (RWNode *)*local_40;
        nodeToDot(this,pRVar2);
        printf("\tNODE%p->NODE%p [style=dotted constraint=false color=blue]\n",pRVar2,local_48);
      }
      std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
                ((_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_40);
    }
    pRVar2 = local_48;
    if ((local_48 != (RWNode *)0x0) && (*(int *)(local_48 + 0x90) == 0xd)) {
      plVar3 = *(long **)(local_48 + 0x160);
      for (plVar8 = *(long **)(local_48 + 0x158); plVar8 != plVar3; plVar8 = plVar8 + 2) {
        if ((undefined8 *)*plVar8 == (undefined8 *)0x0) {
          printf("\tNODE%p->NODE%p [style=dashed constraint=false color=blue]\n",pRVar2,plVar8[1]);
        }
        else {
          lVar6 = **(long **)*plVar8;
          lVar4 = *(long *)(lVar6 + 0x38);
          if (lVar4 == lVar6 + 0x38) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(undefined8 *)(lVar4 + 0x10);
          }
          printf("\tNODE%p->NODE%p [penwidth=4 color=blue ltail=cluster_subg_%p]\n",pRVar2,uVar7);
        }
      }
    }
  }
  return;
}

Assistant:

void dumpNodeEdges(RWNode *node) {
        static std::set<RWNode *> dumped;
        if (!dumped.insert(node).second)
            return;

        if (verbose || node->isPhi()) {
            for (RWNode *def : node->defuse) {
                printf("\tNODE%p->NODE%p [style=dotted constraint=false]\n",
                       static_cast<void *>(def), static_cast<void *>(node));
            }
        }
        if (!graph_only && node->isUse()) {
            for (RWNode *def : DDA->getDefinitions(node)) {
                nodeToDot(def);
                printf("\tNODE%p->NODE%p [style=dotted constraint=false "
                       "color=blue]\n",
                       static_cast<void *>(def), static_cast<void *>(node));
            }
        }
        if (auto *C = RWNodeCall::get(node)) {
            for (auto &cv : C->getCallees()) {
                if (auto *s = cv.getSubgraph()) {
                    assert(s->getRoot() && "Subgraph has no root");
                    printf("\tNODE%p->NODE%p "
                           "[penwidth=4 color=blue "
                           "ltail=cluster_subg_%p]\n",
                           static_cast<void *>(C),
                           static_cast<const void *>(s->getRoot()), s);
                } else {
                    printf("\tNODE%p->NODE%p [style=dashed constraint=false "
                           "color=blue]\n",
                           static_cast<void *>(C),
                           static_cast<void *>(cv.getCalledValue()));
                }
            }
        }
    }